

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionChamberElementType::IfcDistributionChamberElementType
          (IfcDistributionChamberElementType *this)

{
  *(undefined ***)&this->field_0x1d0 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x1d8 = 0;
  *(char **)&this->field_0x1e0 = "IfcDistributionChamberElementType";
  IfcDistributionFlowElementType::IfcDistributionFlowElementType
            (&this->super_IfcDistributionFlowElementType,&PTR_construction_vtable_24__00877798);
  *(undefined8 *)&(this->super_IfcDistributionFlowElementType).field_0x1a8 = 0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = 0x877640;
  *(undefined8 *)&this->field_0x1d0 = 0x877780;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = 0x877668;
  (this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.super_IfcElementType
  .super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x877690;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = 0x8776b8;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.field_0x148 = 0x8776e0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.field_0x180 = 0x877708;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
    super_IfcElementType.field_0x190 = 0x877730;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.field_0x1a0 =
       0x877758;
  *(undefined1 **)&(this->super_IfcDistributionFlowElementType).field_0x1b0 = &this->field_0x1c0;
  *(undefined8 *)&this->field_0x1b8 = 0;
  this->field_0x1c0 = 0;
  return;
}

Assistant:

IfcDistributionChamberElementType() : Object("IfcDistributionChamberElementType") {}